

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  ushort uVar1;
  ushort uVar2;
  params *ppVar3;
  raw_node *prVar4;
  potential_solution *ppVar5;
  undefined4 *puVar6;
  bool bVar7;
  uint8 uVar8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar9;
  undefined4 *puVar10;
  int iVar11;
  ulong uVar12;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar13;
  raw_node *prVar14;
  uint8 *__s;
  uint8 *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint8 uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  uVar1 = (this->m_best_solution).m_coords.m_low_color;
  uVar2 = (this->m_best_solution).m_coords.m_high_color;
  bVar7 = uVar1 < uVar2;
  if ((this->m_best_solution).m_alpha_block != false) {
    bVar7 = uVar1 >= uVar2 && uVar1 != uVar2;
  }
  this->m_pResults->m_alternate_rounding = (this->m_best_solution).m_alternate_rounding;
  this->m_pResults->m_enforce_selector = (this->m_best_solution).m_enforce_selector;
  this->m_pResults->m_enforced_selector = (this->m_best_solution).m_enforced_selector;
  this->m_pResults->m_reordered = bVar7;
  if (bVar7 == false) {
    this->m_pResults->m_low_color = (this->m_best_solution).m_coords.m_low_color;
    ppVar5 = (potential_solution *)&(this->m_best_solution).m_coords.m_high_color;
  }
  else {
    ppVar5 = &this->m_best_solution;
    this->m_pResults->m_low_color = (this->m_best_solution).m_coords.m_high_color;
  }
  this->m_pResults->m_high_color = (ppVar5->m_coords).m_low_color;
  puVar10 = &g_invTableColor;
  if (((this->m_best_solution).m_alpha_block & 1U) != 0) {
    puVar10 = &g_invTableAlpha;
  }
  puVar6 = &g_invTableNull;
  if (bVar7 != false) {
    puVar6 = puVar10;
  }
  ppVar3 = this->m_pParams;
  aVar9.m_u32 = 0;
  if (ppVar3->m_pixels_have_alpha == true) {
    aVar9.m_u32 = ppVar3->m_dxt1a_alpha_threshold << 0x18;
  }
  paVar13 = &ppVar3->m_pPixels->field_0;
  __s = this->m_pResults->m_pSelectors;
  if ((this->m_unique_colors).m_size != 1 || ppVar3->m_pixels_have_alpha != false) {
    puVar15 = __s + ppVar3->m_num_pixels;
    uVar8 = '\0';
    uVar18 = 0;
    do {
      uVar20 = '\x03';
      if ((aVar9.m_u32 <= paVar13->m_u32) &&
         (uVar16 = paVar13->m_u32 | 0xff000000, uVar20 = uVar8, uVar16 != uVar18)) {
        if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_00177423:
          uVar19 = (this->m_unique_color_hash_map).m_values.m_size;
        }
        else {
          uVar18 = uVar16 * -0x61c88647 >>
                   ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f);
          uVar12 = (ulong)uVar18;
          prVar4 = (this->m_unique_color_hash_map).m_values.m_p;
          bVar7 = true;
          uVar19 = uVar18;
          if (prVar4[uVar12].m_bits[8] != '\0') {
            prVar14 = prVar4 + uVar12;
            if (*(uint *)prVar14->m_bits == uVar16) {
              bVar7 = false;
            }
            else {
              uVar22 = (ulong)((this->m_unique_color_hash_map).m_values.m_size - 1);
              do {
                iVar11 = (int)uVar12;
                uVar12 = (ulong)(iVar11 - 1);
                if (iVar11 == 0) {
                  uVar12 = uVar22;
                }
                uVar19 = (uint)uVar12;
                prVar14 = prVar14 + -1;
                if (iVar11 == 0) {
                  prVar14 = prVar4 + uVar22;
                }
                if ((uVar19 == uVar18) || (prVar14->m_bits[8] == '\0')) goto LAB_0017741f;
              } while (*(uint *)prVar14->m_bits != uVar16);
              bVar7 = false;
            }
          }
LAB_0017741f:
          if (bVar7) goto LAB_00177423;
        }
        uVar20 = *(uint8 *)((long)puVar6 +
                           (ulong)(this->m_best_solution).m_selectors.m_p
                                  [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar19].
                                             m_bits + 4)]);
        uVar8 = uVar20;
        uVar18 = uVar16;
      }
      paVar13 = paVar13 + 1;
      *__s = uVar20;
      __s = __s + 1;
    } while (__s != puVar15);
    goto LAB_00177504;
  }
  if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_001774db:
    uVar18 = (this->m_unique_color_hash_map).m_values.m_size;
  }
  else {
    uVar17 = paVar13->m_u32 | 0xff000000;
    uVar16 = uVar17 * -0x61c88647 >> ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f);
    prVar4 = (this->m_unique_color_hash_map).m_values.m_p;
    bVar7 = true;
    uVar18 = uVar16;
    if (prVar4[uVar16].m_bits[8] != '\0') {
      prVar14 = prVar4 + uVar16;
      if (*(uint *)prVar14->m_bits == uVar17) {
        bVar7 = false;
      }
      else {
        uVar21 = (this->m_unique_color_hash_map).m_values.m_size - 1;
        do {
          bVar23 = uVar18 == 0;
          prVar14 = prVar14 + -1;
          uVar18 = uVar18 - 1;
          if (bVar23) {
            prVar14 = prVar4 + uVar21;
            uVar18 = uVar21;
          }
          if ((uVar18 == uVar16) || (prVar14->m_bits[8] == '\0')) goto LAB_001774d7;
        } while (*(uint *)prVar14->m_bits != uVar17);
        bVar7 = false;
      }
    }
LAB_001774d7:
    if (bVar7) goto LAB_001774db;
  }
  memset(__s,(uint)*(byte *)((long)puVar6 +
                            (ulong)(this->m_best_solution).m_selectors.m_p
                                   [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar18].
                                              m_bits + 4)]),(ulong)ppVar3->m_num_pixels);
LAB_00177504:
  this->m_pResults->m_alpha_block = (this->m_best_solution).m_alpha_block;
  this->m_pResults->m_error = (this->m_best_solution).m_error;
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution() {
  compute_selectors();
  bool invert_selectors;

  if (m_best_solution.m_alpha_block)
    invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
  else {
    CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

    invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
  }

  m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
  m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
  m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
  m_pResults->m_reordered = invert_selectors;
  if (invert_selectors) {
    m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
    m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
  } else {
    m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
    m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
  }

  const uint8* pInvert_table = g_invTableNull;
  if (invert_selectors)
    pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;

  const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

  const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
  uint8* pDst_selectors = m_pResults->m_pSelectors;

  if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha)) {
    uint32 c = utils::read_le32(pSrc_pixels);

    CRNLIB_ASSERT(c >= alpha_thresh);

    c |= 0xFF000000U;

    unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
    CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

    uint unique_color_index = it->second;

    uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

    memset(pDst_selectors, selector, m_pParams->m_num_pixels);
  } else {
    uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

    uint8 prev_selector = 0;
    uint32 prev_color = 0;

    do {
      uint32 c = utils::read_le32(pSrc_pixels);
      pSrc_pixels++;

      uint8 selector = 3;

      if (c >= alpha_thresh) {
        c |= 0xFF000000U;

        if (c == prev_color)
          selector = prev_selector;
        else {
          unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

          CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

          uint unique_color_index = it->second;

          selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

          prev_color = c;
          prev_selector = selector;
        }
      }

      *pDst_selectors++ = selector;

    } while (pDst_selectors != pDst_selectors_end);
  }

  m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
  m_pResults->m_error = m_best_solution.m_error;
}